

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O3

sunindextype
SUNDlsMat_bandGBTRF(sunrealtype **a,sunindextype n,sunindextype mu,sunindextype ml,sunindextype smu,
                   sunindextype *p)

{
  long lVar1;
  sunrealtype *psVar2;
  long lVar3;
  double dVar4;
  long lVar5;
  sunindextype sVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  sunrealtype sVar17;
  
  if (0 < n && (smu - mu != 0 && mu <= smu)) {
    lVar14 = 0;
    do {
      memset(a[lVar14],0,(smu - mu) * 8);
      lVar14 = lVar14 + 1;
    } while (n != lVar14);
  }
  lVar14 = n + -1;
  if (1 < n) {
    lVar12 = 0;
    do {
      psVar2 = a[lVar12];
      lVar10 = lVar12 + ml;
      if (n <= lVar12 + ml) {
        lVar10 = lVar14;
      }
      pdVar11 = psVar2 + smu + 1;
      sVar17 = psVar2[smu];
      lVar9 = lVar12;
      if (lVar12 < lVar10) {
        dVar16 = ABS(sVar17);
        lVar5 = lVar12;
        pdVar7 = pdVar11;
        do {
          lVar5 = lVar5 + 1;
          dVar4 = ABS(*pdVar7);
          lVar8 = lVar5;
          if (ABS(*pdVar7) <= dVar16) {
            dVar4 = dVar16;
            lVar8 = lVar9;
          }
          lVar9 = lVar8;
          dVar16 = dVar4;
          pdVar7 = pdVar7 + 1;
        } while (lVar5 < lVar10);
      }
      lVar5 = lVar12 + 1;
      *p = lVar9;
      dVar16 = psVar2[(lVar9 - lVar12) + smu];
      if ((dVar16 == 0.0) && (!NAN(dVar16))) {
        return lVar5;
      }
      if (lVar9 != lVar12) {
        psVar2[(lVar9 - lVar12) + smu] = sVar17;
        psVar2[smu] = dVar16;
        sVar17 = dVar16;
      }
      if (lVar12 < lVar10) {
        lVar8 = 0;
        do {
          pdVar11[lVar8] = pdVar11[lVar8] * (-1.0 / sVar17);
          lVar15 = lVar12 + lVar8;
          lVar8 = lVar8 + 1;
        } while (lVar15 + 1 < lVar10);
      }
      lVar8 = smu * 8;
      lVar1 = lVar5;
      lVar15 = lVar12;
      lVar13 = lVar12 + smu;
      if (lVar14 <= lVar12 + smu) {
        lVar13 = lVar14;
      }
      while (lVar3 = lVar1, lVar15 < lVar13) {
        psVar2 = a[lVar3];
        dVar16 = psVar2[(lVar9 - lVar3) + smu];
        if (lVar9 != lVar12) {
          psVar2[(lVar9 - lVar3) + smu] = psVar2[(lVar12 - lVar3) + smu];
          psVar2[(lVar12 - lVar3) + smu] = dVar16;
        }
        if (dVar16 != 0.0 && lVar12 < lVar10) {
          lVar15 = 0;
          do {
            *(double *)((long)psVar2 + lVar15 * 8 + lVar8) =
                 pdVar11[lVar15] * dVar16 + *(double *)((long)psVar2 + lVar15 * 8 + lVar8);
            lVar1 = lVar12 + lVar15;
            lVar15 = lVar15 + 1;
          } while (lVar1 + 1 < lVar10);
        }
        lVar8 = lVar8 + -8;
        lVar1 = lVar3 + 1;
        lVar15 = lVar3;
      }
      p = p + 1;
      lVar12 = lVar5;
    } while (lVar5 != lVar14);
  }
  *p = lVar14;
  sVar6 = n;
  if (a[n + -1][smu] != 0.0) {
    sVar6 = 0;
  }
  if (NAN(a[n + -1][smu])) {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

sunindextype SUNDlsMat_bandGBTRF(sunrealtype** a, sunindextype n,
                                 sunindextype mu, sunindextype ml,
                                 sunindextype smu, sunindextype* p)
{
  sunindextype c, r, num_rows;
  sunindextype i, j, k, l, storage_l, storage_k, last_col_k, last_row_k;
  sunrealtype *a_c, *col_k, *diag_k, *sub_diag_k, *col_j, *kptr, *jptr;
  sunrealtype max, temp, mult, a_kj;
  sunbooleantype swap;

  /* zero out the first smu - mu rows of the rectangular array a */

  num_rows = smu - mu;
  if (num_rows > 0)
  {
    for (c = 0; c < n; c++)
    {
      a_c = a[c];
      for (r = 0; r < num_rows; r++) { a_c[r] = ZERO; }
    }
  }

  /* k = elimination step number */

  for (k = 0; k < n - 1; k++, p++)
  {
    col_k      = a[k];
    diag_k     = col_k + smu;
    sub_diag_k = diag_k + 1;
    last_row_k = SUNMIN(n - 1, k + ml);

    /* find l = pivot row number */

    l   = k;
    max = SUNRabs(*diag_k);
    for (i = k + 1, kptr = sub_diag_k; i <= last_row_k; i++, kptr++)
    {
      if (SUNRabs(*kptr) > max)
      {
        l   = i;
        max = SUNRabs(*kptr);
      }
    }
    storage_l = ROW(l, k, smu);
    *p        = l;

    /* check for zero pivot element */

    if (col_k[storage_l] == ZERO) { return (k + 1); }

    /* swap a(l,k) and a(k,k) if necessary */

    if ((swap = (l != k)))
    {
      temp             = col_k[storage_l];
      col_k[storage_l] = *diag_k;
      *diag_k          = temp;
    }

    /* Scale the elements below the diagonal in         */
    /* column k by -1.0 / a(k,k). After the above swap, */
    /* a(k,k) holds the pivot element. This scaling     */
    /* stores the pivot row multipliers -a(i,k)/a(k,k)  */
    /* in a(i,k), i=k+1, ..., SUNMIN(n-1,k+ml).            */

    mult = -ONE / (*diag_k);
    for (i = k + 1, kptr = sub_diag_k; i <= last_row_k; i++, kptr++)
    {
      (*kptr) *= mult;
    }

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., SUNMIN(n-1,k+ml) */
    /* row k is the pivot row after swapping with row l.                */
    /* The computation is done one column at a time,                    */
    /* column j=k+1, ..., SUNMIN(k+smu,n-1).                               */

    last_col_k = SUNMIN(k + smu, n - 1);
    for (j = k + 1; j <= last_col_k; j++)
    {
      col_j     = a[j];
      storage_l = ROW(l, j, smu);
      storage_k = ROW(k, j, smu);
      a_kj      = col_j[storage_l];

      /* Swap the elements a(k,j) and a(k,l) if l!=k. */

      if (swap)
      {
        col_j[storage_l] = col_j[storage_k];
        col_j[storage_k] = a_kj;
      }

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j) */
      /* a_kj = a(k,j), *kptr = - a(i,k)/a(k,k), *jptr = a(i,j) */

      if (a_kj != ZERO)
      {
        for (i = k + 1, kptr = sub_diag_k, jptr = col_j + ROW(k + 1, j, smu);
             i <= last_row_k; i++, kptr++, jptr++)
        {
          (*jptr) += a_kj * (*kptr);
        }
      }
    }
  }

  /* set the last pivot row to be n-1 and check for a zero pivot */

  *p = n - 1;
  if (a[n - 1][smu] == ZERO) { return (n); }

  /* return 0 to indicate success */

  return (0);
}